

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

int sexp_param_index(sexp ctx,sexp lambda,sexp name)

{
  sexp psVar1;
  int iVar2;
  sexp psVar3;
  
  psVar1 = (lambda->value).type.cpl;
  do {
    iVar2 = 0;
    psVar3 = psVar1;
    if (((ulong)psVar1 & 3) == 0) {
      iVar2 = 0;
      do {
        if (psVar3->tag != 6) break;
        if ((psVar3->value).type.name == name) {
          return iVar2;
        }
        iVar2 = iVar2 + 1;
        psVar3 = (psVar3->value).type.cpl;
      } while (((ulong)psVar3 & 3) == 0);
    }
    if (psVar3 == name) {
      return iVar2;
    }
    psVar3 = (lambda->value).type.setters;
    if (((ulong)psVar3 & 3) == 0) {
      iVar2 = -5;
      do {
        if (psVar3->tag != 6) break;
        if ((psVar3->value).type.name == name) {
          return iVar2;
        }
        psVar3 = (psVar3->value).type.cpl;
        iVar2 = iVar2 + -1;
      } while (((ulong)psVar3 & 3) == 0);
    }
    if ((((ulong)name & 3) != 0) || (name->tag != 0x16)) {
      sexp_warn(ctx,"can\'t happen: no argument: ",name);
      return -10000;
    }
    name = (name->value).type.slots;
  } while( true );
}

Assistant:

int sexp_param_index (sexp ctx, sexp lambda, sexp name) {
  sexp ls;
  int i;
  while (1) {
    ls = sexp_lambda_params(lambda);
    for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++)
      if (sexp_car(ls) == name)
        return i;
    if (ls == name)
      return i;
    ls = sexp_lambda_locals(lambda);
    for (i=-1; sexp_pairp(ls); ls=sexp_cdr(ls), i--)
      if (sexp_car(ls) == name)
        return i-4;
    if (sexp_synclop(name))
      name = sexp_synclo_expr(name);
    else
      break;
  }
  sexp_warn(ctx, "can't happen: no argument: ", name);
  return -10000;
}